

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O1

void __thiscall higan::TcpConnection::ConnectionEstablished(TcpConnection *this)

{
  undefined8 uVar1;
  __shared_ptr<higan::TcpConnection,(__gnu_cxx::_Lock_policy)2> local_20 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  if ((this->new_connection_callback_).super__Function_base._M_manager != (_Manager_type)0x0) {
    std::__shared_ptr<higan::TcpConnection,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<higan::TcpConnection,void>
              (local_20,(__weak_ptr<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2> *)this);
    if ((this->new_connection_callback_).super__Function_base._M_manager == (_Manager_type)0x0) {
      uVar1 = std::__throw_bad_function_call();
      if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
      }
      _Unwind_Resume(uVar1);
    }
    (*(this->new_connection_callback_)._M_invoker)
              ((_Any_data *)&this->new_connection_callback_,
               (shared_ptr<higan::TcpConnection> *)local_20);
    if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
    }
  }
  Channel::EnableReadable(&this->channel_);
  this->connecting_ = true;
  return;
}

Assistant:

void TcpConnection::ConnectionEstablished()
{
	if (new_connection_callback_)
	{
		new_connection_callback_(shared_from_this());
	}

	channel_.EnableReadable();
	connecting_ = true;
}